

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void horizontal_filter_avx2
               (__m256i src,__m256i *horz_out,int sx,int alpha,int beta,int row,__m256i *shuffle_src
               ,__m256i *round_const,__m128i *shift)

{
  __m256i src_00;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar3 [32];
  undefined1 auVar15 [32];
  
  uVar1 = beta + sx;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = av1_filter_8bit[uVar1 >> 10];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = av1_filter_8bit[(uint)sx >> 10];
  auVar3._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar3._16_16_ = ZEXT116(1) * auVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = av1_filter_8bit[alpha + uVar1 >> 10];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = av1_filter_8bit[(uint)(alpha + sx) >> 10];
  auVar5._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar10;
  auVar5._16_16_ = ZEXT116(1) * auVar6;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = av1_filter_8bit[uVar1 + alpha * 2 >> 10];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = av1_filter_8bit[(uint)(sx + alpha * 2) >> 10];
  auVar7._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar16;
  auVar7._16_16_ = ZEXT116(1) * auVar12;
  auVar3 = vpunpcklwd_avx2(auVar3,auVar7);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = av1_filter_8bit[alpha * 3 + uVar1 >> 10];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = av1_filter_8bit[(uint)(alpha * 3 + sx) >> 10];
  auVar8._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
  auVar8._16_16_ = ZEXT116(1) * auVar18;
  auVar5 = vpunpcklwd_avx2(auVar5,auVar8);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = av1_filter_8bit[uVar1 + alpha * 4 >> 10];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = av1_filter_8bit[(uint)(sx + alpha * 4) >> 10];
  auVar9._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar21;
  auVar9._16_16_ = ZEXT116(1) * auVar20;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = av1_filter_8bit[alpha * 5 + uVar1 >> 10];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = av1_filter_8bit[(uint)(alpha * 5 + sx) >> 10];
  auVar11._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar23;
  auVar11._16_16_ = ZEXT116(1) * auVar22;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = av1_filter_8bit[alpha * 6 + uVar1 >> 10];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = av1_filter_8bit[(uint)(alpha * 6 + sx) >> 10];
  auVar14._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar25;
  auVar14._16_16_ = ZEXT116(1) * auVar24;
  auVar7 = vpunpcklwd_avx2(auVar9,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = av1_filter_8bit[uVar1 + alpha * 7 >> 10];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = av1_filter_8bit[(uint)(sx + alpha * 7) >> 10];
  auVar15._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar13;
  auVar15._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
  auVar8 = vpunpcklwd_avx2(auVar11,auVar15);
  auVar9 = vpunpckldq_avx2(auVar3,auVar7);
  auVar3 = vpunpckhdq_avx2(auVar3,auVar7);
  auVar7 = vpunpckldq_avx2(auVar5,auVar8);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar8);
  src_00 = (__m256i)vpunpcklqdq_avx2(auVar9,auVar7);
  vpunpckhqdq_avx2(auVar9,auVar7);
  vpunpcklqdq_avx2(auVar3,auVar5);
  vpunpckhqdq_avx2(auVar3,auVar5);
  filter_src_pixels_avx2
            (src_00,horz_out,(__m256i *)&stack0xffffffffffffff40,shuffle_src,(__m256i *)src[0],
             (__m128i *)src[1],row);
  return;
}

Assistant:

static inline void horizontal_filter_avx2(const __m256i src, __m256i *horz_out,
                                          int sx, int alpha, int beta, int row,
                                          const __m256i *shuffle_src,
                                          const __m256i *round_const,
                                          const __m128i *shift) {
  __m256i coeff[4];
  prepare_horizontal_filter_coeff_avx2(alpha, beta, sx, coeff);
  filter_src_pixels_avx2(src, horz_out, coeff, shuffle_src, round_const, shift,
                         row);
}